

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_resolveFlattenMissingComponent_Test::TestBody
          (ModelFlattening_resolveFlattenMissingComponent_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  element_type *peVar4;
  AssertHelper local_268 [8];
  Message local_260 [8];
  shared_ptr<libcellml::Issue> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_2;
  Message local_210 [8];
  unsigned_long local_208 [2];
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_1;
  ModelPtr flatModel;
  string local_1d0 [32];
  undefined8 local_1b0;
  undefined1 local_1a8 [8];
  ModelPtr pointModel;
  Message local_190 [8];
  unsigned_long local_188 [2];
  undefined1 local_178 [8];
  AssertionResult gtest_ar;
  string local_160 [32];
  string local_140 [32];
  undefined1 local_120 [8];
  ImporterPtr importer;
  string local_108 [32];
  string local_e8 [32];
  undefined1 local_c8 [8];
  ModelPtr originalModel;
  ParserPtr parser;
  allocator<char> local_91;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string e;
  ModelFlattening_resolveFlattenMissingComponent_Test *this_local;
  
  e.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"importer/",&local_91);
  resourcePath((string *)&local_70);
  std::operator+(&local_50,
                 "Component \'left\' imports a component named \'pointyBit\' from the model imported from \'"
                 ,&local_70);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50,"diamond_point.cellml\'. The component could not be found.");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  this_00 = &originalModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_108,"importer/diamond.cellml",
             (allocator<char> *)
             ((long)&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  fileContents(local_e8);
  libcellml::Parser::parseModel((string *)local_c8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Importer::create
            (SUB81((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_120,0));
  peVar2 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_160,"importer/",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  resourcePath(local_140);
  libcellml::Importer::resolveImports((shared_ptr *)peVar2,(string *)local_c8);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  local_188[1] = 0;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_120);
  local_188[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_178,"size_t(0)","importer->issueCount()",local_188 + 1,
             local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(local_190);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &pointModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x3d2,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &pointModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_190);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &pointModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_120);
  local_1b0 = 1;
  libcellml::Importer::library((ulong *)local_1a8);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d0,"pointyBit",
             (allocator<char> *)
             ((long)&flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ComponentEntity::removeComponent((string *)peVar4,SUB81(local_1d0,0));
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_120);
  libcellml::Importer::flattenModel((shared_ptr *)&gtest_ar_1.message_);
  local_208[1] = 1;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_120);
  local_208[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1f8,"size_t(1)","importer->issueCount()",local_208 + 1,
             local_208);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(local_210);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x3da,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_120);
  libcellml::Logger::issue((ulong)&local_258);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_258);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_228,"e","importer->issue(0)->description()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             &local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_258);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(local_260);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              (local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x3db,pcVar3);
    testing::internal::AssertHelper::operator=(local_268,local_260);
    testing::internal::AssertHelper::~AssertHelper(local_268);
    testing::Message::~Message(local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)&gtest_ar_1.message_);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_1a8);
  std::shared_ptr<libcellml::Importer>::~shared_ptr((shared_ptr<libcellml::Importer> *)local_120);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_c8);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &originalModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(ModelFlattening, resolveFlattenMissingComponent)
{
    const std::string e =
        "Component 'left' imports a component named 'pointyBit' from the model imported from '" + resourcePath("importer/") + "diamond_point.cellml'. The component could not be found.";
    auto parser = libcellml::Parser::create();
    auto originalModel = parser->parseModel(fileContents("importer/diamond.cellml"));
    auto importer = libcellml::Importer::create();

    // Resolve imports.
    importer->resolveImports(originalModel, resourcePath("importer/"));
    EXPECT_EQ(size_t(0), importer->issueCount());

    // Corrupt the importer library by removing a component from a model that's required.
    auto pointModel = importer->library(1);
    pointModel->removeComponent("pointyBit");

    // Attempt to flatten the model.
    auto flatModel = importer->flattenModel(originalModel);
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ(e, importer->issue(0)->description());
}